

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  bool bVar1;
  iterator pcVar2;
  iterator pcVar3;
  ostream *poVar4;
  uint8 *puVar5;
  atomic<int> *paVar6;
  LogMessage local_360;
  StartInfo *local_1e0;
  StartInfo *info;
  uint local_1d0;
  uint flags;
  int start;
  LogMessage local_1c0;
  StringPiece *local_40;
  StringPiece *context;
  StringPiece *text;
  SearchParams *params_local;
  DFA *this_local;
  int local_14;
  memory_order __b;
  
  local_40 = &params->context;
  context = &params->text;
  text = &params->text;
  params_local = (SearchParams *)this;
  pcVar2 = StringPiece::begin(&params->text);
  pcVar3 = StringPiece::begin(local_40);
  if (pcVar3 <= pcVar2) {
    pcVar2 = StringPiece::end(context);
    pcVar3 = StringPiece::end(local_40);
    if (pcVar2 <= pcVar3) {
      if (((ulong)text[2].ptr_ & 0x10000) == 0) {
        pcVar2 = StringPiece::end(context);
        pcVar3 = StringPiece::end(local_40);
        if (pcVar2 == pcVar3) {
          local_1d0 = 0;
          info._4_4_ = 5;
        }
        else {
          pcVar2 = StringPiece::end(context);
          if (*pcVar2 == '\n') {
            local_1d0 = 2;
            info._4_4_ = 1;
          }
          else {
            puVar5 = (uint8 *)StringPiece::end(context);
            bVar1 = Prog::IsWordChar(*puVar5);
            if (bVar1) {
              local_1d0 = 4;
              info._4_4_ = 0x2000;
            }
            else {
              local_1d0 = 6;
              info._4_4_ = 0;
            }
          }
        }
      }
      else {
        pcVar2 = StringPiece::begin(context);
        pcVar3 = StringPiece::begin(local_40);
        if (pcVar2 == pcVar3) {
          local_1d0 = 0;
          info._4_4_ = 5;
        }
        else {
          pcVar2 = StringPiece::begin(context);
          if (pcVar2[-1] == '\n') {
            local_1d0 = 2;
            info._4_4_ = 1;
          }
          else {
            pcVar2 = StringPiece::begin(context);
            bVar1 = Prog::IsWordChar(pcVar2[-1]);
            if (bVar1) {
              local_1d0 = 4;
              info._4_4_ = 0x2000;
            }
            else {
              local_1d0 = 6;
              info._4_4_ = 0;
            }
          }
        }
      }
      if ((((ulong)text[2].ptr_ & 1) != 0) || (bVar1 = Prog::anchor_start(this->prog_), bVar1)) {
        local_1d0 = local_1d0 | 1;
      }
      local_1e0 = this->start_ + (int)local_1d0;
      bVar1 = AnalyzeSearchHelper(this,(SearchParams *)text,local_1e0,info._4_4_);
      if (!bVar1) {
        ResetCache(this,*(RWLocker **)&text[3].length_);
        bVar1 = AnalyzeSearchHelper(this,(SearchParams *)text,local_1e0,info._4_4_);
        if (!bVar1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_360,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                     0x67d);
          poVar4 = LogMessage::stream(&local_360);
          std::operator<<(poVar4,"Failed to analyze start state.");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_360);
          *(undefined1 *)&text[4].ptr_ = 1;
          return false;
        }
      }
      *(State **)&text[2].length_ = local_1e0->start;
      paVar6 = &local_1e0->firstbyte;
      local_14 = 2;
      ___b = paVar6;
      std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_14 - 1U < 2) {
        this_local._4_4_ = (paVar6->super___atomic_base<int>)._M_i;
      }
      else if (local_14 == 5) {
        this_local._4_4_ = (paVar6->super___atomic_base<int>)._M_i;
      }
      else {
        this_local._4_4_ = (paVar6->super___atomic_base<int>)._M_i;
      }
      *(__int_type *)&text[3].ptr_ = this_local._4_4_;
      return true;
    }
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x64e);
  poVar4 = LogMessage::stream(&local_1c0);
  std::operator<<(poVar4,"Text is not inside context.");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
  *(undefined8 *)&text[2].length_ = 1;
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "Text is not inside context.";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored || prog_->anchor_start())
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s firstbyte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->firstbyte.load());

  params->start = info->start;
  params->firstbyte = info->firstbyte.load(std::memory_order_acquire);

  return true;
}